

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# future.hpp
# Opt level: O2

void __thiscall boost::detail::shared_state_base::notify_deferred(shared_state_base *this)

{
  unique_lock<boost::mutex> lock;
  unique_lock<boost::mutex> local_20;
  
  unique_lock<boost::mutex>::unique_lock(&local_20,(mutex *)(this + 0x30));
  mark_finished_internal(this,&local_20);
  unique_lock<boost::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void notify_deferred()
            {
              boost::unique_lock<boost::mutex> lock(this->mutex);
              mark_finished_internal(lock);
            }